

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# def_net_methods.cpp
# Opt level: O0

void Marshall_string_proc(int the_socket,Am_Value *in_value,Am_Connection *my_connection_ptr)

{
  uint32_t uVar1;
  char *pcVar2;
  char *in_str;
  long net_size;
  size_t local_30;
  long size;
  Am_String in_am_str;
  Am_Connection *my_connection_ptr_local;
  Am_Value *in_value_local;
  int the_socket_local;
  
  in_am_str.data = (Am_String_Data *)my_connection_ptr;
  Am_String::Am_String((Am_String *)&size,in_value);
  pcVar2 = Am_String::operator_cast_to_char_((Am_String *)&size);
  local_30 = strlen(pcVar2);
  local_30 = local_30 + 1;
  uVar1 = htonl((uint32_t)local_30);
  in_str = (char *)(ulong)uVar1;
  pcVar2 = Am_String::operator_cast_to_char_((Am_String *)&size);
  send(the_socket,&in_str,8,0);
  send(the_socket,pcVar2,local_30,0);
  Am_String::~Am_String((Am_String *)&size);
  return;
}

Assistant:

Am_Define_Method(Am_Marshall_Method, void, Marshall_string,
                 (int the_socket, const Am_Value &in_value,
                  Am_Connection *my_connection_ptr))
{
  (void)my_connection_ptr; //avoid warning,  used by Lists & Obj
  Am_String in_am_str = in_value;
  long size = strlen((const char *)in_am_str) + 1;
  long net_size = htonl(size);
  const char *in_str = in_am_str;
  send(the_socket, &net_size, sizeof(net_size), 0);
  send(the_socket, in_str, size, 0);
}